

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  uint __line;
  size_t sVar1;
  char *__assertion;
  int64_t i;
  long lVar2;
  float extraout_XMM0_Da;
  
  sVar1 = Matrix::size(A,0);
  if (sVar1 == (this->data_).size_) {
    sVar1 = Matrix::size(A,1);
    if (sVar1 == (vec->data_).size_) {
      for (lVar2 = 0; lVar2 < (long)(this->data_).size_; lVar2 = lVar2 + 1) {
        (*A->_vptr_Matrix[2])(A,vec,lVar2);
        (this->data_).mem_[lVar2] = extraout_XMM0_Da;
      }
      return;
    }
    __assertion = "A.size(1) == vec.size()";
    __line = 0x46;
  }
  else {
    __assertion = "A.size(0) == size()";
    __line = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,__line,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}